

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<unsigned_int,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,uint value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  StringRef sep_00;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  CharPtr pwVar4;
  lconv *plVar5;
  wchar_t *pwVar6;
  uint in_ESI;
  undefined8 in_RDI;
  CharPtr p_4;
  uint size;
  StringRef sep;
  uint num_digits_4;
  wchar_t *p_3;
  uint num_digits_3;
  UnsignedType n_2;
  wchar_t *p_2;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  wchar_t *p_1;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  char *in_stack_fffffffffffffed8;
  BasicStringRef<char> *in_stack_fffffffffffffee0;
  wchar_t *in_stack_fffffffffffffef0;
  char *local_e0;
  char local_d1;
  uint prefix_size_00;
  char *in_stack_ffffffffffffff40;
  FormatSpec *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff54;
  BasicWriter<wchar_t> *in_stack_ffffffffffffff58;
  undefined7 local_a0;
  char in_stack_ffffffffffffff67;
  LConvCheck<char_*lconv::*,_&lconv::thousands_sep> local_89;
  StringRef local_88;
  BasicStringRef<char> local_78;
  uint local_64;
  wchar_t *local_60;
  int local_58;
  uint local_54;
  wchar_t *local_50;
  int local_48;
  uint local_44;
  wchar_t *local_38;
  int local_30;
  uint local_2c;
  wchar_t *local_28;
  uint local_1c;
  char local_18 [4];
  uint local_14;
  uint local_10;
  
  prefix_size_00 = (uint)((ulong)in_RDI >> 0x20);
  local_10 = 0;
  local_14 = in_ESI;
  memset(local_18,0,4);
  bVar1 = internal::is_negative<unsigned_int>(0);
  if (bVar1) {
    local_18[0] = '-';
    local_10 = local_10 + 1;
    local_14 = -local_14;
  }
  else {
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,2);
      local_d1 = '+';
      if (!bVar1) {
        local_d1 = ' ';
      }
      local_18[0] = local_d1;
      local_10 = local_10 + 1;
    }
  }
  cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
  if (cVar2 == '\0') {
LAB_00350272:
    local_1c = internal::count_digits(0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,prefix_size_00);
    local_28 = pwVar4 + 1;
    get(local_28);
    internal::format_decimal<unsigned_int,wchar_t>
              ((wchar_t *)in_stack_fffffffffffffee0,(uint)((ulong)in_stack_fffffffffffffed8 >> 0x20)
               ,(uint)in_stack_fffffffffffffed8);
    return;
  }
  if (cVar2 == 'B') {
LAB_0035043f:
    local_44 = local_14;
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
    if (bVar1) {
      uVar3 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_18[uVar3] = '0';
      cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
      uVar3 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_18[uVar3] = cVar2;
    }
    local_48 = 0;
    do {
      local_48 = local_48 + 1;
      local_44 = local_44 >> 1;
    } while (local_44 != 0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,prefix_size_00);
    local_50 = get(pwVar4);
    local_44 = local_14;
    do {
      *local_50 = (local_44 & 1) + L'0';
      local_44 = local_44 >> 1;
      local_50 = local_50 + -1;
    } while (local_44 != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_0035043f;
      if (cVar2 == 'd') goto LAB_00350272;
      if (cVar2 == 'n') {
        local_64 = internal::count_digits(0);
        BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        plVar5 = localeconv();
        internal::LConvCheck<char_*lconv::*,_&lconv::thousands_sep>::LConvCheck(&local_89,0);
        local_88 = internal::thousands_sep<lconv>(plVar5);
        local_78.data_ = local_88.data_;
        local_78.size_ = local_88.size_;
        uVar3 = (ulong)local_64;
        BasicStringRef<char>::size(&local_78);
        pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,prefix_size_00);
        pwVar6 = get(pwVar4 + 1);
        sep_00.size_ = local_78.size_;
        sep_00.data_ = local_78.data_;
        internal::ThousandsSep::ThousandsSep((ThousandsSep *)&stack0xffffffffffffff50,sep_00);
        thousands_sep.sep_.size_ = uVar3;
        thousands_sep.sep_.data_ = (char *)plVar5;
        thousands_sep._16_8_ = pwVar6;
        internal::format_decimal<unsigned_int,wchar_t,fmt::internal::ThousandsSep>
                  (in_stack_fffffffffffffef0,
                   (uint)(CONCAT17(in_stack_ffffffffffffff67,local_a0) >> 0x20),(uint)local_a0,
                   thousands_sep);
        return;
      }
      if (cVar2 == 'o') {
        local_54 = local_14;
        bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
        if (bVar1) {
          uVar3 = (ulong)local_10;
          local_10 = local_10 + 1;
          local_18[uVar3] = '0';
        }
        local_58 = 0;
        do {
          local_58 = local_58 + 1;
          local_54 = local_54 >> 3;
        } while (local_54 != 0);
        pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,prefix_size_00);
        local_60 = get(pwVar4);
        local_54 = local_14;
        do {
          *local_60 = (local_54 & 7) + L'0';
          local_54 = local_54 >> 3;
          local_60 = local_60 + -1;
        } while (local_54 != 0);
        return;
      }
      if (cVar2 != 'x') {
        FormatSpec::type((FormatSpec *)&stack0x00000008);
        FormatSpec::flag((FormatSpec *)&stack0x00000008,0x10);
        internal::report_unknown_type(in_stack_ffffffffffffff67,(char *)in_stack_ffffffffffffff58);
        return;
      }
    }
    local_2c = local_14;
    bVar1 = FormatSpec::flag((FormatSpec *)&stack0x00000008,8);
    if (bVar1) {
      uVar3 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_18[uVar3] = '0';
      cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
      uVar3 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_18[uVar3] = cVar2;
    }
    local_30 = 0;
    do {
      local_30 = local_30 + 1;
      local_2c = local_2c >> 4;
    } while (local_2c != 0);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,prefix_size_00);
    local_38 = get(pwVar4);
    local_2c = local_14;
    cVar2 = FormatSpec::type((FormatSpec *)&stack0x00000008);
    if (cVar2 == 'x') {
      local_e0 = "0123456789abcdef";
    }
    else {
      local_e0 = "0123456789ABCDEF";
    }
    do {
      *local_38 = (int)local_e0[local_2c & 0xf];
      local_2c = local_2c >> 4;
      local_38 = local_38 + -1;
    } while (local_2c != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}